

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::AnimationSampler::operator==(AnimationSampler *this,AnimationSampler *other)

{
  bool bVar1;
  __type _Var2;
  int *in_RSI;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  Value *in_stack_ffffffffffffffd8;
  bool local_11;
  Value *__rhs;
  
  __rhs = in_RDI;
  bVar1 = Value::operator==(in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    bVar1 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_RDI,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                             *)in_stack_ffffffffffffffd8);
    local_11 = false;
    if ((bVar1) && (local_11 = false, in_RDI->type_ == *in_RSI)) {
      _Var2 = std::operator==(unaff_retaddr,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs);
      local_11 = false;
      if (_Var2) {
        local_11 = in_RDI->int_value_ == in_RSI[1];
      }
    }
  }
  return local_11;
}

Assistant:

bool AnimationSampler::operator==(const AnimationSampler &other) const {
  return this->extras == other.extras && this->extensions == other.extensions &&
         this->input == other.input &&
         this->interpolation == other.interpolation &&
         this->output == other.output;
}